

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Vector<float,_4>_> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::
ApplyReflect<4,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>::apply
          (ApplyReflect<4,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>
           *this,ExpandContext *ctx,ExprP<tcu::Vector<float,_4>_> *i,
          ExprP<tcu::Vector<float,_4>_> *n)

{
  SharedPtrStateBase *arg0;
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Vector<float,_4>_> EVar1;
  float local_10c;
  ExprP<float> local_108;
  ExprP<float> local_f8;
  ExprP<tcu::Vector<float,_4>_> local_e8;
  float local_d4;
  ExprP<float> local_d0;
  ExprP<tcu::Vector<float,_4>_> local_c0;
  ExprP<tcu::Vector<float,_4>_> local_b0;
  ExprP<tcu::Vector<float,_4>_> local_a0;
  ExprP<float> local_90 [2];
  allocator<char> local_69;
  string local_68;
  VariableP<float> local_48;
  undefined1 local_38 [8];
  ExprP<float> dotNI;
  ExprP<tcu::Vector<float,_4>_> *n_local;
  ExprP<tcu::Vector<float,_4>_> *i_local;
  ExpandContext *ctx_local;
  
  dotNI.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = (SharedPtrStateBase *)n;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"dotNI",&local_69);
  dot<4>((Functions *)local_90,
         (ExprP<tcu::Vector<float,_4>_> *)
         dotNI.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state,i);
  bindExpression<float>((BuiltinPrecisionTests *)&local_48,&local_68,ctx,local_90);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)local_38);
  VariableP<float>::~VariableP(&local_48);
  ExprP<float>::~ExprP(local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_c0,
             (ExprP<tcu::Vector<float,_4>_> *)
             dotNI.super_ExprPBase<float>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state,
             (ExprP<float> *)local_38);
  local_d4 = 2.0;
  constant<float>((BuiltinPrecisionTests *)&local_d0,&local_d4);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_b0,&local_c0,&local_d0);
  arg0 = dotNI.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state;
  local_10c = 2.0;
  constant<float>((BuiltinPrecisionTests *)&local_108,&local_10c);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_f8,(ExprP<float> *)local_38,&local_108);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_e8,(ExprP<tcu::Vector<float,_4>_> *)arg0,&local_f8);
  alternatives<tcu::Vector<float,4>>((BuiltinPrecisionTests *)&local_a0,&local_b0,&local_e8);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)this,i,&local_a0);
  ExprP<tcu::Vector<float,_4>_>::~ExprP(&local_a0);
  ExprP<tcu::Vector<float,_4>_>::~ExprP(&local_e8);
  ExprP<float>::~ExprP(&local_f8);
  ExprP<float>::~ExprP(&local_108);
  ExprP<tcu::Vector<float,_4>_>::~ExprP(&local_b0);
  ExprP<float>::~ExprP(&local_d0);
  ExprP<tcu::Vector<float,_4>_>::~ExprP(&local_c0);
  ExprP<float>::~ExprP((ExprP<float> *)local_38);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_4>_>.super_ExprPBase<tcu::Vector<float,_4>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_4>_>.super_ExprPBase<tcu::Vector<float,_4>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_4>_> *)this;
  return (ExprP<tcu::Vector<float,_4>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
         super_ExprPBase<tcu::Vector<float,_4>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>;
}

Assistant:

static ExprP<Ret> apply	(ExpandContext&		ctx,
							 const ExprP<Arg0>&	i,
							 const ExprP<Arg1>&	n)
	{
		const ExprP<float>	dotNI	= bindExpression("dotNI", ctx, dot(n, i));

		return i - alternatives((n * dotNI) * constant(2.0f),
								n * (dotNI * constant(2.0f)));
	}